

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

void __thiscall cmGeneratorTarget::ComputeTargetManifest(cmGeneratorTarget *this,string *config)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TargetType TVar2;
  cmGlobalGenerator *this_00;
  string f;
  Names targetNames;
  string dir;
  string local_1f0;
  undefined1 *local_1d0;
  undefined8 local_1c8;
  undefined1 local_1c0;
  undefined7 uStack_1bf;
  undefined1 *local_1b0;
  long local_1a8;
  undefined1 local_1a0;
  undefined7 uStack_19f;
  undefined1 *local_190;
  long local_188;
  undefined1 local_180;
  undefined7 uStack_17f;
  undefined1 *local_170;
  long local_168;
  undefined1 local_160;
  undefined7 uStack_15f;
  undefined1 *local_150;
  long local_148;
  undefined1 local_140;
  undefined7 uStack_13f;
  undefined1 *local_130;
  long local_128;
  undefined1 local_120;
  undefined7 uStack_11f;
  undefined1 local_110 [32];
  _Alloc_hider local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  _Alloc_hider local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  _Alloc_hider local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  _Alloc_hider local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  _Alloc_hider local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  string local_50;
  
  if (this->Target->IsImportedTarget != false) {
    return;
  }
  this_00 = this->LocalGenerator->GlobalGenerator;
  local_1d0 = &local_1c0;
  local_1c8 = 0;
  local_1c0 = 0;
  local_1b0 = &local_1a0;
  local_1a8 = 0;
  local_1a0 = 0;
  local_190 = &local_180;
  local_188 = 0;
  local_180 = 0;
  local_170 = &local_160;
  local_168 = 0;
  local_160 = 0;
  local_150 = &local_140;
  local_148 = 0;
  local_140 = 0;
  local_130 = &local_120;
  local_128 = 0;
  local_120 = 0;
  TVar2 = this->Target->TargetTypeValue;
  if (TVar2 - STATIC_LIBRARY < 3) {
    GetLibraryNames((Names *)local_110,this,config);
  }
  else {
    if (TVar2 != EXECUTABLE) goto LAB_0016c340;
    GetExecutableNames((Names *)local_110,this,config);
  }
  std::__cxx11::string::operator=((string *)&local_1d0,(string *)local_110);
  std::__cxx11::string::operator=((string *)&local_1b0,(string *)&local_f0);
  std::__cxx11::string::operator=((string *)&local_190,(string *)&local_d0);
  std::__cxx11::string::operator=((string *)&local_170,(string *)&local_b0);
  std::__cxx11::string::operator=((string *)&local_150,(string *)&local_90);
  std::__cxx11::string::operator=((string *)&local_130,(string *)&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_p != &local_60) {
    operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_p != &local_80) {
    operator_delete(local_90._M_p,local_80._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_p != &local_a0) {
    operator_delete(local_b0._M_p,local_a0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_p != &local_c0) {
    operator_delete(local_d0._M_p,local_c0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_p != &local_e0) {
    operator_delete(local_f0._M_p,local_e0._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
    operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
  }
  GetDirectory((string *)local_110,this,config,RuntimeBinaryArtifact);
  paVar1 = &local_1f0.field_2;
  local_1f0._M_string_length = 0;
  local_1f0.field_2._M_local_buf[0] = '\0';
  local_1f0._M_dataplus._M_p = (pointer)paVar1;
  if (local_1a8 != 0) {
    std::__cxx11::string::_M_assign((string *)&local_1f0);
    std::__cxx11::string::append((char *)&local_1f0);
    std::__cxx11::string::_M_append((char *)&local_1f0,(ulong)local_1b0);
    cmGlobalGenerator::AddToManifest(this_00,&local_1f0);
  }
  if (local_128 != 0) {
    std::__cxx11::string::_M_assign((string *)&local_1f0);
    std::__cxx11::string::append((char *)&local_1f0);
    std::__cxx11::string::_M_append((char *)&local_1f0,(ulong)local_130);
    cmGlobalGenerator::AddToManifest(this_00,&local_1f0);
  }
  if (local_188 != 0) {
    std::__cxx11::string::_M_assign((string *)&local_1f0);
    std::__cxx11::string::append((char *)&local_1f0);
    std::__cxx11::string::_M_append((char *)&local_1f0,(ulong)local_190);
    cmGlobalGenerator::AddToManifest(this_00,&local_1f0);
  }
  if (local_148 != 0) {
    std::__cxx11::string::_M_assign((string *)&local_1f0);
    std::__cxx11::string::append((char *)&local_1f0);
    std::__cxx11::string::_M_append((char *)&local_1f0,(ulong)local_150);
    cmGlobalGenerator::AddToManifest(this_00,&local_1f0);
  }
  if (local_168 != 0) {
    GetDirectory(&local_50,this,config,ImportLibraryArtifact);
    std::__cxx11::string::operator=((string *)&local_1f0,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)&local_1f0);
    std::__cxx11::string::_M_append((char *)&local_1f0,(ulong)local_170);
    cmGlobalGenerator::AddToManifest(this_00,&local_1f0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f0._M_dataplus._M_p,
                    CONCAT71(local_1f0.field_2._M_allocated_capacity._1_7_,
                             local_1f0.field_2._M_local_buf[0]) + 1);
  }
  if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
    operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130,CONCAT71(uStack_11f,local_120) + 1);
  }
LAB_0016c340:
  if (local_150 != &local_140) {
    operator_delete(local_150,CONCAT71(uStack_13f,local_140) + 1);
  }
  if (local_170 != &local_160) {
    operator_delete(local_170,CONCAT71(uStack_15f,local_160) + 1);
  }
  if (local_190 != &local_180) {
    operator_delete(local_190,CONCAT71(uStack_17f,local_180) + 1);
  }
  if (local_1b0 != &local_1a0) {
    operator_delete(local_1b0,CONCAT71(uStack_19f,local_1a0) + 1);
  }
  if (local_1d0 != &local_1c0) {
    operator_delete(local_1d0,CONCAT71(uStack_1bf,local_1c0) + 1);
  }
  return;
}

Assistant:

bool cmGeneratorTarget::IsImported() const
{
  return this->Target->IsImported();
}